

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::CurrentProgramBindingTestCase::test
          (CurrentProgramBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  GLuint shader;
  GLenum GVar3;
  GLuint shader_00;
  GLuint program;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  ScopedLogSection section;
  ScopedLogSection section_1;
  GLint compileStatus;
  GLint linkStatus;
  string local_108;
  string local_e8;
  ScopedLogSection local_c8;
  long local_c0;
  TestLog local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  string local_88;
  ScopedLogSection local_68;
  ResultCollector *local_60;
  int local_54;
  CurrentProgramBindingTestCase *local_50;
  int local_44;
  code *local_40;
  GLenum local_38;
  
  pTVar2 = gl->m_log;
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_60 = result;
  local_50 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Initial","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Initial","");
  tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar2,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (local_60,gl,0x8b8d,0,(local_50->super_BindingTest).m_type);
  tcu::TestLog::endSection(local_c8.m_log);
  pTVar2 = gl->m_log;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"VertexShader","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Vertex Shader","");
  tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar2,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  shader = glu::CallLogWrapper::glCreateShader(gl,0x8b31);
  glu::CallLogWrapper::glShaderSource(gl,shader,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(gl,shader);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_88._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar7 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_88._M_string_length + local_a0) goto LAB_00f932d2;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8)
      ;
    }
    else {
LAB_00f932d2:
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    }
    local_c8.m_log = &local_b8;
    pTVar2 = (TestLog *)(plVar4 + 2);
    if ((TestLog *)*plVar4 == pTVar2) {
      local_b8.m_log = pTVar2->m_log;
      lStack_b0 = plVar4[3];
    }
    else {
      local_b8.m_log = pTVar2->m_log;
      local_c8.m_log = (TestLog *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)pTVar2;
    plVar4[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar4[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_108._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar4[3];
      local_e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.m_log != &local_b8) {
      operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  glu::CallLogWrapper::glGetShaderiv(gl,shader,0x8b81,&local_54);
  if (local_54 != 1) {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"expected GL_TRUE","");
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endSection(local_68.m_log);
  pTVar2 = gl->m_log;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"FragmentShader","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Fragment Shader","");
  tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar2,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  shader_00 = glu::CallLogWrapper::glCreateShader(gl,0x8b30);
  glu::CallLogWrapper::glShaderSource(gl,shader_00,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(gl,shader_00);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_88._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar7 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_88._M_string_length + local_a0) goto LAB_00f93646;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8)
      ;
    }
    else {
LAB_00f93646:
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    }
    local_c8.m_log = &local_b8;
    pTVar2 = (TestLog *)(plVar4 + 2);
    if ((TestLog *)*plVar4 == pTVar2) {
      local_b8.m_log = pTVar2->m_log;
      lStack_b0 = plVar4[3];
    }
    else {
      local_b8.m_log = pTVar2->m_log;
      local_c8.m_log = (TestLog *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)pTVar2;
    plVar4[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar4[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_108._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar4[3];
      local_e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.m_log != &local_b8) {
      operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  glu::CallLogWrapper::glGetShaderiv(gl,shader_00,0x8b81,&local_54);
  if (local_54 != 1) {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"expected GL_TRUE","");
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endSection(local_68.m_log);
  pTVar2 = gl->m_log;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Program","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Create and bind program","")
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar2,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  program = glu::CallLogWrapper::glCreateProgram(gl);
  glu::CallLogWrapper::glAttachShader(gl,program,shader);
  glu::CallLogWrapper::glAttachShader(gl,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(gl,program);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_88._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar7 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_88._M_string_length + local_a0) goto LAB_00f939bc;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8)
      ;
    }
    else {
LAB_00f939bc:
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    }
    local_c8.m_log = &local_b8;
    pTVar2 = (TestLog *)(plVar4 + 2);
    if ((TestLog *)*plVar4 == pTVar2) {
      local_b8.m_log = pTVar2->m_log;
      lStack_b0 = plVar4[3];
    }
    else {
      local_b8.m_log = pTVar2->m_log;
      local_c8.m_log = (TestLog *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)pTVar2;
    plVar4[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar4[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_108._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar4[3];
      local_e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.m_log != &local_b8) {
      operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  glu::CallLogWrapper::glGetProgramiv(gl,program,0x8b82,&local_44);
  if (local_44 != 1) {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"expected GL_TRUE","");
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  glu::CallLogWrapper::glUseProgram(gl,program);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_88._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar7 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_88._M_string_length + local_a0) goto LAB_00f93c79;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8)
      ;
    }
    else {
LAB_00f93c79:
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    }
    local_c8.m_log = &local_b8;
    pTVar2 = (TestLog *)(plVar4 + 2);
    if ((TestLog *)*plVar4 == pTVar2) {
      local_b8.m_log = pTVar2->m_log;
      lStack_b0 = plVar4[3];
    }
    else {
      local_b8.m_log = pTVar2->m_log;
      local_c8.m_log = (TestLog *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)pTVar2;
    plVar4[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar4[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_108._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar4[3];
      local_e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.m_log != &local_b8) {
      operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (local_60,gl,0x8b8d,program,(local_50->super_BindingTest).m_type);
  tcu::TestLog::endSection(local_68.m_log);
  pTVar2 = gl->m_log;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Delete","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"Delete program while in use","");
  tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar2,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteShader(gl,shader);
  glu::CallLogWrapper::glDeleteShader(gl,shader_00);
  glu::CallLogWrapper::glDeleteProgram(gl,program);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
    local_40 = glu::getErrorName;
    local_38 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
    uVar6 = 0xf;
    if (local_a8 != local_98) {
      uVar6 = local_98[0];
    }
    if (uVar6 < local_88._M_string_length + local_a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar7 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_88._M_string_length + local_a0) goto LAB_00f93f96;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8)
      ;
    }
    else {
LAB_00f93f96:
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    }
    local_c8.m_log = &local_b8;
    pTVar2 = (TestLog *)(plVar4 + 2);
    if ((TestLog *)*plVar4 == pTVar2) {
      local_b8.m_log = pTVar2->m_log;
      lStack_b0 = plVar4[3];
    }
    else {
      local_b8.m_log = pTVar2->m_log;
      local_c8.m_log = (TestLog *)*plVar4;
    }
    local_c0 = plVar4[1];
    *plVar4 = (long)pTVar2;
    plVar4[1] = 0;
    *(undefined1 *)&pTVar2->m_log = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108.field_2._8_8_ = plVar4[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar5;
      local_108._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_108._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = plVar4[3];
      local_e8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::ResultCollector::fail(local_60,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.m_log != &local_b8) {
      operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (local_60,gl,0x8b8d,program,(local_50->super_BindingTest).m_type);
  tcu::TestLog::endSection(local_68.m_log);
  pTVar2 = gl->m_log;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Unbind","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Unbind program","");
  tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar2,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glUseProgram(gl,0);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 == 0) goto LAB_00f9443c;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Got Error ","");
  local_40 = glu::getErrorName;
  local_38 = GVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_40);
  uVar6 = 0xf;
  if (local_a8 != local_98) {
    uVar6 = local_98[0];
  }
  if (uVar6 < local_88._M_string_length + local_a0) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar7 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_88._M_string_length + local_a0) goto LAB_00f9429d;
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_00f9429d:
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
  }
  local_c8.m_log = &local_b8;
  pTVar2 = (TestLog *)(plVar4 + 2);
  if ((TestLog *)*plVar4 == pTVar2) {
    local_b8.m_log = pTVar2->m_log;
    lStack_b0 = plVar4[3];
  }
  else {
    local_b8.m_log = pTVar2->m_log;
    local_c8.m_log = (TestLog *)*plVar4;
  }
  local_c0 = plVar4[1];
  *plVar4 = (long)pTVar2;
  plVar4[1] = 0;
  *(undefined1 *)&pTVar2->m_log = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_108.field_2._M_allocated_capacity = *psVar5;
    local_108.field_2._8_8_ = plVar4[3];
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar5;
    local_108._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_108._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_e8.field_2._M_allocated_capacity = *psVar5;
    local_e8.field_2._8_8_ = plVar4[3];
    local_e8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar5;
    local_e8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_e8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  tcu::ResultCollector::fail(local_60,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.m_log != &local_b8) {
    operator_delete(local_c8.m_log,(ulong)((long)&(local_b8.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
LAB_00f9443c:
  deqp::gls::StateQueryUtil::verifyStateInteger
            (local_60,gl,0x8b8d,0,(local_50->super_BindingTest).m_type);
  tcu::TestLog::endSection(local_68.m_log);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		static const char* testVertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n";
		static const char* testFragSource =
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		GLuint	shaderVert;
		GLuint	shaderFrag;
		GLuint	shaderProg;
		GLint	compileStatus;
		GLint	linkStatus;

		{
			const tcu::ScopedLogSection section(gl.getLog(), "Initial", "Initial");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, 0, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "VertexShader", "Vertex Shader");

			shaderVert = gl.glCreateShader(GL_VERTEX_SHADER);
			gl.glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
			gl.glCompileShader(shaderVert);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glCompileShader");

			gl.glGetShaderiv(shaderVert, GL_COMPILE_STATUS, &compileStatus);
			if (compileStatus != GL_TRUE)
				result.fail("expected GL_TRUE");
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "FragmentShader", "Fragment Shader");

			shaderFrag = gl.glCreateShader(GL_FRAGMENT_SHADER);
			gl.glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);
			gl.glCompileShader(shaderFrag);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glCompileShader");

			gl.glGetShaderiv(shaderFrag, GL_COMPILE_STATUS, &compileStatus);
			if (compileStatus != GL_TRUE)
				result.fail("expected GL_TRUE");
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Program", "Create and bind program");

			shaderProg = gl.glCreateProgram();
			gl.glAttachShader(shaderProg, shaderVert);
			gl.glAttachShader(shaderProg, shaderFrag);
			gl.glLinkProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glLinkProgram");

			gl.glGetProgramiv(shaderProg, GL_LINK_STATUS, &linkStatus);
			if (linkStatus != GL_TRUE)
				result.fail("expected GL_TRUE");

			gl.glUseProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glUseProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, shaderProg, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Delete", "Delete program while in use");

			gl.glDeleteShader(shaderVert);
			gl.glDeleteShader(shaderFrag);
			gl.glDeleteProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, shaderProg, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Unbind", "Unbind program");
			gl.glUseProgram(0);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glUseProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, 0, m_type);
		}
	}